

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanBlockScalar(Scanner *this,bool IsLiteral)

{
  iterator pcVar1;
  undefined4 LineBreaks_00;
  uint uVar2;
  bool bVar3;
  uint local_244;
  StringRef local_230;
  string local_220;
  undefined1 local_200 [16];
  undefined1 local_1f0 [8];
  Token T;
  StringRef local_1a8;
  code *local_198;
  undefined8 local_190;
  iterator local_188;
  iterator LineStart;
  undefined1 local_178 [8];
  SmallString<256U> Str;
  uint LineBreaks;
  uint BlockExitIndent;
  iterator Start;
  uint local_50;
  char local_4a;
  bool IsDone;
  uint BlockIndent;
  char ChompingIndicator;
  bool IsLiteral_local;
  Scanner *this_local;
  size_t local_38;
  iterator local_30;
  StringRef *local_28;
  iterator local_20;
  iterator local_18;
  undefined1 *local_10;
  
  bVar3 = true;
  if (*this->Current != '|') {
    bVar3 = *this->Current == '>';
  }
  IsDone = IsLiteral;
  _BlockIndent = this;
  if (!bVar3) {
    __assert_fail("*Current == \'|\' || *Current == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                  ,0x62c,"bool llvm::yaml::Scanner::scanBlockScalar(bool)");
  }
  skip(this,1);
  Start._7_1_ = 0;
  bVar3 = scanBlockScalarHeader(this,&local_4a,&local_50,(bool *)((long)&Start + 7));
  if (bVar3) {
    if ((Start._7_1_ & 1) == 0) {
      pcVar1 = this->Current;
      if (this->Indent < 0) {
        local_244 = 0;
      }
      else {
        local_244 = this->Indent;
      }
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfc].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)(undefined1)local_244;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfd].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)local_244._1_1_;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfe].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)local_244._2_1_;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xff].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)local_244._3_1_;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf8].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf9].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfa].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfb].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      if ((local_50 != 0) ||
         (bVar3 = findBlockScalarIndent
                            (this,&local_50,local_244,
                             (uint *)(Str.super_SmallVector<char,_256U>.
                                      super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8),
                             (bool *)((long)&Start + 7)), bVar3)) {
        SmallString<256U>::SmallString((SmallString<256U> *)local_178);
        while (((Start._7_1_ ^ 0xff) & 1) != 0) {
          bVar3 = scanBlockScalarIndent
                            (this,local_50,
                             Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                             InlineElts._252_4_,(bool *)((long)&Start + 7));
          if (!bVar3) {
            this_local._7_1_ = 0;
            LineStart._4_4_ = 1;
            goto LAB_00222400;
          }
          if ((Start._7_1_ & 1) != 0) break;
          local_188 = this->Current;
          local_198 = skip_nb_char;
          local_190 = 0;
          advanceWhile(this,0x21e960);
          if (local_188 != this->Current) {
            SmallString<256U>::append
                      ((SmallString<256U> *)local_178,
                       (ulong)(uint)Str.super_SmallVector<char,_256U>.
                                    super_SmallVectorStorage<char,_256U>.InlineElts._248_4_,'\n');
            local_38 = (long)this->Current - (long)local_188;
            local_28 = &local_1a8;
            local_30 = local_188;
            local_1a8.Data = local_188;
            local_1a8.Length = local_38;
            SmallString<256U>::append((SmallString<256U> *)local_178,local_1a8);
            Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf8].
            super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
            Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf9].
            super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
            Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfa].
            super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
            Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfb].
            super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
          }
          if ((this->Current == this->End) || (bVar3 = consumeLineBreakIfPresent(this), !bVar3))
          break;
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_4_
               = Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
                 _248_4_ + 1;
        }
        if ((this->Current == this->End) &&
           (Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
            _248_4_ == 0)) {
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf8].
          super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x1;
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf9].
          super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfa].
          super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfb].
          super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
        }
        LineBreaks_00 =
             Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
             _248_4_;
        join_0x00000010_0x00000000_ =
             llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_178);
        uVar2 = getChompedLineBreaks(local_4a,LineBreaks_00,join_0x00000010_0x00000000_);
        SmallString<256U>::append((SmallString<256U> *)local_178,(ulong)uVar2,'\n');
        if (this->FlowLevel == 0) {
          this->IsSimpleKeyAllowed = true;
        }
        Token::Token((Token *)local_1f0);
        local_1f0._0_4_ = TK_BlockScalar;
        T.Range.Data = this->Current + -(long)pcVar1;
        local_10 = local_200;
        T._0_8_ = pcVar1;
        local_20 = T.Range.Data;
        local_18 = pcVar1;
        local_230 = SmallString<256U>::str((SmallString<256U> *)local_178);
        StringRef::str_abi_cxx11_(&local_220,&local_230);
        std::__cxx11::string::operator=((string *)&T.Range.Length,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
        ::push_back(&this->TokenQueue,(Token *)local_1f0);
        this_local._7_1_ = 1;
        LineStart._4_4_ = 1;
        Token::~Token((Token *)local_1f0);
LAB_00222400:
        SmallString<256U>::~SmallString((SmallString<256U> *)local_178);
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Scanner::scanBlockScalar(bool IsLiteral) {
  // Eat '|' or '>'
  assert(*Current == '|' || *Current == '>');
  skip(1);

  char ChompingIndicator;
  unsigned BlockIndent;
  bool IsDone = false;
  if (!scanBlockScalarHeader(ChompingIndicator, BlockIndent, IsDone))
    return false;
  if (IsDone)
    return true;

  auto Start = Current;
  unsigned BlockExitIndent = Indent < 0 ? 0 : (unsigned)Indent;
  unsigned LineBreaks = 0;
  if (BlockIndent == 0) {
    if (!findBlockScalarIndent(BlockIndent, BlockExitIndent, LineBreaks,
                               IsDone))
      return false;
  }

  // Scan the block's scalars body.
  SmallString<256> Str;
  while (!IsDone) {
    if (!scanBlockScalarIndent(BlockIndent, BlockExitIndent, IsDone))
      return false;
    if (IsDone)
      break;

    // Parse the current line.
    auto LineStart = Current;
    advanceWhile(&Scanner::skip_nb_char);
    if (LineStart != Current) {
      Str.append(LineBreaks, '\n');
      Str.append(StringRef(LineStart, Current - LineStart));
      LineBreaks = 0;
    }

    // Check for EOF.
    if (Current == End)
      break;

    if (!consumeLineBreakIfPresent())
      break;
    ++LineBreaks;
  }

  if (Current == End && !LineBreaks)
    // Ensure that there is at least one line break before the end of file.
    LineBreaks = 1;
  Str.append(getChompedLineBreaks(ChompingIndicator, LineBreaks, Str), '\n');

  // New lines may start a simple key.
  if (!FlowLevel)
    IsSimpleKeyAllowed = true;

  Token T;
  T.Kind = Token::TK_BlockScalar;
  T.Range = StringRef(Start, Current - Start);
  T.Value = Str.str().str();
  TokenQueue.push_back(T);
  return true;
}